

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_MorphControl::Transform(ON_MorphControl *this,ON_Xform *xform)

{
  int iVar1;
  bool bVar2;
  bool local_21;
  bool rc;
  ON_Xform *xform_local;
  ON_MorphControl *this_local;
  
  bVar2 = ON_Geometry::Transform(&this->super_ON_Geometry,xform);
  if (bVar2) {
    local_21 = false;
    iVar1 = this->m_varient;
    if (iVar1 == 1) {
      local_21 = ON_NurbsCurve::Transform(&this->m_nurbs_curve,xform);
    }
    else if (iVar1 == 2) {
      local_21 = ON_NurbsSurface::Transform(&this->m_nurbs_surface,xform);
    }
    else if (iVar1 == 3) {
      local_21 = ON_NurbsCage::Transform(&this->m_nurbs_cage,xform);
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MorphControl::Transform( 
        const ON_Xform& xform
        )
{
  // Call the base class so any user data is transformed.
  if (!this->ON_Geometry::Transform(xform))
    return false;

  bool rc = false;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.Transform(xform);
    break;

  case 2:
    rc = m_nurbs_surface.Transform(xform);
    break;

  case 3:
    rc = m_nurbs_cage.Transform(xform);
    break;
  }
  return rc;
}